

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall
SQVM::NewSlotA(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val,SQObjectPtr *attrs,
              bool bstatic,bool raw)

{
  SQClass *this_00;
  bool bVar1;
  SQMetaMethod mm;
  SQObjectPtr local_40;
  
  if ((self->super_SQObject)._type == OT_CLASS) {
    this_00 = (self->super_SQObject)._unVal.pClass;
    if ((raw) || (this_00->_metamethods[0x10].super_SQObject._type == OT_NULL)) {
      bVar1 = NewSlot(this,self,key,val,bstatic);
      if (bVar1) {
        bVar1 = true;
        if ((attrs->super_SQObject)._type != OT_NULL) {
          SQClass::SetAttributes(this_00,key,attrs);
        }
      }
      else {
        bVar1 = false;
      }
    }
    else {
      Push(this,self);
      Push(this,key);
      Push(this,val);
      Push(this,attrs);
      local_40.super_SQObject._type = OT_BOOL;
      local_40.super_SQObject._unVal.nInteger._1_7_ = 0;
      local_40.super_SQObject._unVal.nInteger._0_1_ = bstatic;
      Push(this,&local_40);
      SQObjectPtr::~SQObjectPtr(&local_40);
      bVar1 = CallMetaMethod(this,this_00->_metamethods + 0x10,mm,5,&this->temp_reg);
    }
  }
  else {
    bVar1 = false;
    Raise_Error(this,"object must be a class");
  }
  return bVar1;
}

Assistant:

bool SQVM::NewSlotA(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val,const SQObjectPtr &attrs,bool bstatic,bool raw)
{
    if(type(self) != OT_CLASS) {
        Raise_Error(_SC("object must be a class"));
        return false;
    }
    SQClass *c = _class(self);
    if(!raw) {
        SQObjectPtr &mm = c->_metamethods[MT_NEWMEMBER];
        if(type(mm) != OT_NULL ) {
            Push(self); Push(key); Push(val);
            Push(attrs);
            Push(bstatic);
            return CallMetaMethod(mm,MT_NEWMEMBER,5,temp_reg);
        }
    }
    if(!NewSlot(self, key, val,bstatic))
        return false;
    if(type(attrs) != OT_NULL) {
        c->SetAttributes(key,attrs);
    }
    return true;
}